

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::BinaryOp_x86_avx512::forward_inplace
          (BinaryOp_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  _func_int *p_Var1;
  float fVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  float *pfVar6;
  int iVar7;
  undefined1 (*pauVar8) [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  float fVar12;
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 in_ZMM3 [64];
  __m128 afVar29;
  binary_op_pow op;
  __m128 _b;
  __m256 _b_avx;
  __m512 _b_avx512;
  binary_op_pow local_189;
  Mat *local_188;
  ulong local_180;
  ulong local_178;
  float local_170 [2];
  float afStack_168 [2];
  float local_160 [2];
  float afStack_158 [2];
  float afStack_150 [2];
  float afStack_148 [2];
  undefined1 local_140 [16];
  float afStack_130 [2];
  float afStack_128 [2];
  float afStack_120 [2];
  float afStack_118 [2];
  float afStack_110 [2];
  float afStack_108 [2];
  float local_100 [2];
  float afStack_f8 [2];
  float afStack_f0 [2];
  float afStack_e8 [2];
  float afStack_e0 [2];
  float afStack_d8 [2];
  float afStack_d0 [2];
  float afStack_c8 [2];
  float local_c0 [2];
  float afStack_b8 [2];
  float afStack_b0 [2];
  float afStack_a8 [2];
  float afStack_a0 [2];
  float afStack_98 [2];
  float afStack_90 [2];
  float afStack_88 [22];
  
  p_Var1 = this->_vptr_BinaryOp_x86_avx512[-3];
  switch(*(undefined4 *)(&this->field_0xd0 + (long)p_Var1)) {
  case 0:
    auVar9 = vbroadcastss_avx512f(ZEXT416(*(uint *)(&this->field_0xd8 + (long)p_Var1)));
    iVar3 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar5 = 0;
    uVar4 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar4 = uVar5;
    }
    for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
      pauVar8 = (undefined1 (*) [64])
                (bottom_top_blob->cstep * uVar5 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      for (iVar7 = 0; iVar7 + 0xf < iVar3; iVar7 = iVar7 + 0x10) {
        auVar10 = vaddps_avx512f(auVar9,*pauVar8);
        *pauVar8 = auVar10;
        pauVar8 = pauVar8 + 1;
      }
      while( true ) {
        fVar12 = auVar9._0_4_;
        if (iVar3 <= iVar7 + 7) break;
        auVar24._0_4_ = fVar12 + *(float *)*pauVar8;
        auVar24._4_4_ = auVar9._4_4_ + *(float *)(*pauVar8 + 4);
        auVar24._8_4_ = auVar9._8_4_ + *(float *)(*pauVar8 + 8);
        auVar24._12_4_ = auVar9._12_4_ + *(float *)(*pauVar8 + 0xc);
        auVar24._16_4_ = auVar9._16_4_ + *(float *)(*pauVar8 + 0x10);
        auVar24._20_4_ = auVar9._20_4_ + *(float *)(*pauVar8 + 0x14);
        auVar24._24_4_ = auVar9._24_4_ + *(float *)(*pauVar8 + 0x18);
        auVar24._28_4_ = auVar9._28_4_ + *(float *)(*pauVar8 + 0x1c);
        *(undefined1 (*) [32])*pauVar8 = auVar24;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x20);
        iVar7 = iVar7 + 8;
      }
      for (; iVar7 + 3 < iVar3; iVar7 = iVar7 + 4) {
        auVar22._0_4_ = fVar12 + *(float *)*pauVar8;
        auVar22._4_4_ = auVar9._4_4_ + *(float *)(*pauVar8 + 4);
        auVar22._8_4_ = auVar9._8_4_ + *(float *)(*pauVar8 + 8);
        auVar22._12_4_ = auVar9._12_4_ + *(float *)(*pauVar8 + 0xc);
        *(undefined1 (*) [16])*pauVar8 = auVar22;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x10);
      }
      for (; iVar7 < iVar3; iVar7 = iVar7 + 1) {
        *(float *)*pauVar8 = fVar12 + *(float *)*pauVar8;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 4);
      }
    }
    break;
  case 1:
    auVar9 = vbroadcastss_avx512f(ZEXT416(*(uint *)(&this->field_0xd8 + (long)p_Var1)));
    iVar3 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar5 = 0;
    uVar4 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar4 = uVar5;
    }
    for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
      pauVar8 = (undefined1 (*) [64])
                (bottom_top_blob->cstep * uVar5 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      for (iVar7 = 0; iVar7 + 0xf < iVar3; iVar7 = iVar7 + 0x10) {
        auVar10 = vsubps_avx512f(*pauVar8,auVar9);
        *pauVar8 = auVar10;
        pauVar8 = pauVar8 + 1;
      }
      for (; iVar7 + 7 < iVar3; iVar7 = iVar7 + 8) {
        auVar24 = vsubps_avx(*(undefined1 (*) [32])*pauVar8,auVar9._0_32_);
        *(undefined1 (*) [32])*pauVar8 = auVar24;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x20);
      }
      for (; iVar7 + 3 < iVar3; iVar7 = iVar7 + 4) {
        auVar13 = vsubps_avx(*(undefined1 (*) [16])*pauVar8,auVar9._0_16_);
        *(undefined1 (*) [16])*pauVar8 = auVar13;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x10);
      }
      for (; iVar7 < iVar3; iVar7 = iVar7 + 1) {
        *(float *)*pauVar8 = *(float *)*pauVar8 - auVar9._0_4_;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 4);
      }
    }
    break;
  case 2:
    auVar9 = vbroadcastss_avx512f(ZEXT416(*(uint *)(&this->field_0xd8 + (long)p_Var1)));
    iVar3 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar5 = 0;
    uVar4 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar4 = uVar5;
    }
    for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
      pauVar8 = (undefined1 (*) [64])
                (bottom_top_blob->cstep * uVar5 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      for (iVar7 = 0; iVar7 + 0xf < iVar3; iVar7 = iVar7 + 0x10) {
        in_ZMM1 = vmulps_avx512f(auVar9,*pauVar8);
        *pauVar8 = in_ZMM1;
        pauVar8 = pauVar8 + 1;
      }
      while( true ) {
        fVar12 = auVar9._0_4_;
        if (iVar3 <= iVar7 + 7) break;
        auVar25._0_4_ = fVar12 * *(float *)*pauVar8;
        auVar25._4_4_ = auVar9._4_4_ * *(float *)(*pauVar8 + 4);
        auVar25._8_4_ = auVar9._8_4_ * *(float *)(*pauVar8 + 8);
        auVar25._12_4_ = auVar9._12_4_ * *(float *)(*pauVar8 + 0xc);
        auVar25._16_4_ = auVar9._16_4_ * *(float *)(*pauVar8 + 0x10);
        auVar25._20_4_ = auVar9._20_4_ * *(float *)(*pauVar8 + 0x14);
        auVar25._28_36_ = in_ZMM1._28_36_;
        auVar25._24_4_ = auVar9._24_4_ * *(float *)(*pauVar8 + 0x18);
        in_ZMM1 = ZEXT3264(auVar25._0_32_);
        *(undefined1 (*) [32])*pauVar8 = auVar25._0_32_;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x20);
        iVar7 = iVar7 + 8;
      }
      for (; iVar7 + 3 < iVar3; iVar7 = iVar7 + 4) {
        auVar23._0_4_ = fVar12 * *(float *)*pauVar8;
        auVar23._4_4_ = auVar9._4_4_ * *(float *)(*pauVar8 + 4);
        auVar23._8_4_ = auVar9._8_4_ * *(float *)(*pauVar8 + 8);
        auVar23._12_4_ = auVar9._12_4_ * *(float *)(*pauVar8 + 0xc);
        in_ZMM1 = ZEXT1664(auVar23);
        *(undefined1 (*) [16])*pauVar8 = auVar23;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x10);
      }
      for (; iVar7 < iVar3; iVar7 = iVar7 + 1) {
        fVar2 = fVar12 * *(float *)*pauVar8;
        in_ZMM1 = ZEXT464((uint)fVar2);
        *(float *)*pauVar8 = fVar2;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 4);
      }
    }
    break;
  case 3:
    iVar3 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    auVar13._0_4_ = 1.0 / *(float *)(&this->field_0xd8 + (long)p_Var1);
    auVar13._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar9 = vbroadcastss_avx512f(auVar13);
    uVar5 = 0;
    uVar4 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar4 = uVar5;
    }
    for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
      pauVar8 = (undefined1 (*) [64])
                (bottom_top_blob->cstep * uVar5 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      for (iVar7 = 0; iVar7 + 0xf < iVar3; iVar7 = iVar7 + 0x10) {
        in_ZMM2 = vmulps_avx512f(auVar9,*pauVar8);
        *pauVar8 = in_ZMM2;
        pauVar8 = pauVar8 + 1;
      }
      while( true ) {
        if (iVar3 <= iVar7 + 7) break;
        auVar11._0_4_ = auVar9._0_4_ * *(float *)*pauVar8;
        auVar11._4_4_ = auVar9._4_4_ * *(float *)(*pauVar8 + 4);
        auVar11._8_4_ = auVar9._8_4_ * *(float *)(*pauVar8 + 8);
        auVar11._12_4_ = auVar9._12_4_ * *(float *)(*pauVar8 + 0xc);
        auVar11._16_4_ = auVar9._16_4_ * *(float *)(*pauVar8 + 0x10);
        auVar11._20_4_ = auVar9._20_4_ * *(float *)(*pauVar8 + 0x14);
        auVar11._28_36_ = in_ZMM2._28_36_;
        auVar11._24_4_ = auVar9._24_4_ * *(float *)(*pauVar8 + 0x18);
        in_ZMM2 = ZEXT3264(auVar11._0_32_);
        *(undefined1 (*) [32])*pauVar8 = auVar11._0_32_;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x20);
        iVar7 = iVar7 + 8;
      }
      for (; iVar7 + 3 < iVar3; iVar7 = iVar7 + 4) {
        auVar26._0_4_ = auVar9._0_4_ * *(float *)*pauVar8;
        auVar26._4_4_ = auVar9._4_4_ * *(float *)(*pauVar8 + 4);
        auVar26._8_4_ = auVar9._8_4_ * *(float *)(*pauVar8 + 8);
        auVar26._12_4_ = auVar9._12_4_ * *(float *)(*pauVar8 + 0xc);
        in_ZMM2 = ZEXT1664(auVar26);
        *(undefined1 (*) [16])*pauVar8 = auVar26;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x10);
      }
      for (; iVar7 < iVar3; iVar7 = iVar7 + 1) {
        fVar12 = auVar13._0_4_ * *(float *)*pauVar8;
        in_ZMM2 = ZEXT464((uint)fVar12);
        *(float *)*pauVar8 = fVar12;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 4);
      }
    }
    break;
  case 4:
    auVar9 = vbroadcastss_avx512f(ZEXT416(*(uint *)(&this->field_0xd8 + (long)p_Var1)));
    iVar3 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar5 = 0;
    uVar4 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar4 = uVar5;
    }
    for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
      pauVar8 = (undefined1 (*) [64])
                (bottom_top_blob->cstep * uVar5 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      for (iVar7 = 0; iVar7 + 0xf < iVar3; iVar7 = iVar7 + 0x10) {
        auVar10 = vmaxps_avx512f(auVar9,*pauVar8);
        *pauVar8 = auVar10;
        pauVar8 = pauVar8 + 1;
      }
      for (; iVar7 + 7 < iVar3; iVar7 = iVar7 + 8) {
        auVar24 = vmaxps_avx(auVar9._0_32_,*(undefined1 (*) [32])*pauVar8);
        *(undefined1 (*) [32])*pauVar8 = auVar24;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x20);
      }
      for (; iVar7 + 3 < iVar3; iVar7 = iVar7 + 4) {
        auVar13 = vmaxps_avx(auVar9._0_16_,*(undefined1 (*) [16])*pauVar8);
        *(undefined1 (*) [16])*pauVar8 = auVar13;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x10);
      }
      for (; iVar7 < iVar3; iVar7 = iVar7 + 1) {
        auVar13 = vmaxss_avx(auVar9._0_16_,ZEXT416(*(uint *)*pauVar8));
        *(int *)*pauVar8 = auVar13._0_4_;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 4);
      }
    }
    break;
  case 5:
    auVar9 = vbroadcastss_avx512f(ZEXT416(*(uint *)(&this->field_0xd8 + (long)p_Var1)));
    iVar3 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar5 = 0;
    uVar4 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar4 = uVar5;
    }
    for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
      pauVar8 = (undefined1 (*) [64])
                (bottom_top_blob->cstep * uVar5 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      for (iVar7 = 0; iVar7 + 0xf < iVar3; iVar7 = iVar7 + 0x10) {
        auVar10 = vminps_avx512f(auVar9,*pauVar8);
        *pauVar8 = auVar10;
        pauVar8 = pauVar8 + 1;
      }
      for (; iVar7 + 7 < iVar3; iVar7 = iVar7 + 8) {
        auVar24 = vminps_avx(auVar9._0_32_,*(undefined1 (*) [32])*pauVar8);
        *(undefined1 (*) [32])*pauVar8 = auVar24;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x20);
      }
      for (; iVar7 + 3 < iVar3; iVar7 = iVar7 + 4) {
        auVar13 = vminps_avx(auVar9._0_16_,*(undefined1 (*) [16])*pauVar8);
        *(undefined1 (*) [16])*pauVar8 = auVar13;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x10);
      }
      for (; iVar7 < iVar3; iVar7 = iVar7 + 1) {
        auVar13 = vminss_avx(auVar9._0_16_,ZEXT416(*(uint *)*pauVar8));
        *(int *)*pauVar8 = auVar13._0_4_;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 4);
      }
    }
    break;
  case 6:
    _local_140 = vbroadcastss_avx512f(ZEXT416(*(uint *)(&this->field_0xd8 + (long)p_Var1)));
    iVar3 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    local_178 = 0;
    local_180 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_180 = local_178;
    }
    local_188 = bottom_top_blob;
    for (; auVar9 = _local_140, local_178 != local_180; local_178 = local_178 + 1) {
      pfVar6 = (float *)(local_188->cstep * local_178 * local_188->elemsize + (long)local_188->data)
      ;
      local_c0[0] = (float)local_140._0_4_;
      local_c0[1] = (float)local_140._4_4_;
      afStack_b8[0] = (float)local_140._8_4_;
      afStack_b8[1] = (float)local_140._12_4_;
      afStack_b0[0] = afStack_130[0];
      afStack_b0[1] = afStack_130[1];
      afStack_a8[0] = afStack_128[0];
      afStack_a8[1] = afStack_128[1];
      afStack_a0[0] = afStack_120[0];
      afStack_a0[1] = afStack_120[1];
      afStack_98[0] = afStack_118[0];
      afStack_98[1] = afStack_118[1];
      afStack_90[0] = afStack_110[0];
      afStack_90[1] = afStack_110[1];
      afStack_88[0] = afStack_108[0];
      afStack_88[1] = afStack_108[1];
      _local_140 = auVar9;
      for (iVar7 = 0; auVar9 = _local_140, iVar7 + 0xf < iVar3; iVar7 = iVar7 + 0x10) {
        uVar15 = *(undefined8 *)pfVar6;
        uVar14 = *(undefined8 *)(pfVar6 + 2);
        uVar16 = *(undefined8 *)(pfVar6 + 4);
        uVar17 = *(undefined8 *)(pfVar6 + 6);
        uVar18 = *(undefined8 *)(pfVar6 + 8);
        uVar19 = *(undefined8 *)(pfVar6 + 10);
        uVar20 = *(undefined8 *)(pfVar6 + 0xc);
        uVar21 = *(undefined8 *)(pfVar6 + 0xe);
        local_100 = (float  [2])uVar15;
        afStack_f8 = (float  [2])uVar14;
        afStack_f0 = (float  [2])uVar16;
        afStack_e8 = (float  [2])uVar17;
        afStack_e0 = (float  [2])uVar18;
        afStack_d8 = (float  [2])uVar19;
        afStack_d0 = (float  [2])uVar20;
        afStack_c8 = (float  [2])uVar21;
        BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                  (&local_189,(__m512 *)local_100,(__m512 *)local_c0);
        *(undefined8 *)pfVar6 = uVar15;
        *(undefined8 *)(pfVar6 + 2) = uVar14;
        *(undefined8 *)(pfVar6 + 4) = uVar16;
        *(undefined8 *)(pfVar6 + 6) = uVar17;
        *(undefined8 *)(pfVar6 + 8) = uVar18;
        *(undefined8 *)(pfVar6 + 10) = uVar19;
        *(undefined8 *)(pfVar6 + 0xc) = uVar20;
        *(undefined8 *)(pfVar6 + 0xe) = uVar21;
        pfVar6 = pfVar6 + 0x10;
      }
      local_100[0] = (float)local_140._0_4_;
      local_100[1] = (float)local_140._4_4_;
      afStack_f8[0] = (float)local_140._8_4_;
      afStack_f8[1] = (float)local_140._12_4_;
      afStack_f0[0] = afStack_130[0];
      afStack_f0[1] = afStack_130[1];
      afStack_e8[0] = afStack_128[0];
      afStack_e8[1] = afStack_128[1];
      _local_140 = auVar9;
      for (; auVar9 = _local_140, iVar7 + 7 < iVar3; iVar7 = iVar7 + 8) {
        uVar15 = *(undefined8 *)pfVar6;
        uVar14 = *(undefined8 *)(pfVar6 + 2);
        uVar16 = *(undefined8 *)(pfVar6 + 4);
        uVar17 = *(undefined8 *)(pfVar6 + 6);
        local_160 = (float  [2])uVar15;
        afStack_158 = (float  [2])uVar14;
        afStack_150 = (float  [2])uVar16;
        afStack_148 = (float  [2])uVar17;
        BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                  (&local_189,(__m256 *)local_160,(__m256 *)local_100);
        *(undefined8 *)pfVar6 = uVar15;
        *(undefined8 *)(pfVar6 + 2) = uVar14;
        *(undefined8 *)(pfVar6 + 4) = uVar16;
        *(undefined8 *)(pfVar6 + 6) = uVar17;
        pfVar6 = pfVar6 + 8;
      }
      local_160[0] = (float)local_140._0_4_;
      local_160[1] = (float)local_140._4_4_;
      afStack_158[0] = (float)local_140._8_4_;
      afStack_158[1] = (float)local_140._12_4_;
      _local_140 = auVar9;
      for (; iVar7 + 3 < iVar3; iVar7 = iVar7 + 4) {
        local_170 = *(float (*) [2])pfVar6;
        uVar15 = *(undefined8 *)(pfVar6 + 2);
        afStack_168 = (float  [2])uVar15;
        afVar29 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                            (&local_189,(__m128 *)local_170,(__m128 *)local_160);
        *(long *)pfVar6 = afVar29._0_8_;
        *(undefined8 *)(pfVar6 + 2) = uVar15;
        pfVar6 = pfVar6 + 4;
      }
      for (; iVar7 < iVar3; iVar7 = iVar7 + 1) {
        fVar12 = powf(*pfVar6,(float)local_140._0_4_);
        *pfVar6 = fVar12;
        pfVar6 = pfVar6 + 1;
      }
    }
    break;
  case 7:
    auVar9 = vbroadcastss_avx512f(ZEXT416(*(uint *)(&this->field_0xd8 + (long)p_Var1)));
    iVar3 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar5 = 0;
    uVar4 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar4 = uVar5;
    }
    for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
      pauVar8 = (undefined1 (*) [64])
                (bottom_top_blob->cstep * uVar5 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      for (iVar7 = 0; iVar7 + 0xf < iVar3; iVar7 = iVar7 + 0x10) {
        auVar10 = vsubps_avx512f(auVar9,*pauVar8);
        *pauVar8 = auVar10;
        pauVar8 = pauVar8 + 1;
      }
      for (; iVar7 + 7 < iVar3; iVar7 = iVar7 + 8) {
        auVar24 = vsubps_avx(auVar9._0_32_,*(undefined1 (*) [32])*pauVar8);
        *(undefined1 (*) [32])*pauVar8 = auVar24;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x20);
      }
      for (; iVar7 + 3 < iVar3; iVar7 = iVar7 + 4) {
        auVar13 = vsubps_avx(auVar9._0_16_,*(undefined1 (*) [16])*pauVar8);
        *(undefined1 (*) [16])*pauVar8 = auVar13;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x10);
      }
      for (; iVar7 < iVar3; iVar7 = iVar7 + 1) {
        *(float *)*pauVar8 = auVar9._0_4_ - *(float *)*pauVar8;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 4);
      }
    }
    break;
  case 8:
    auVar9 = vbroadcastss_avx512f(ZEXT416(*(uint *)(&this->field_0xd8 + (long)p_Var1)));
    iVar3 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar5 = 0;
    uVar4 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar4 = uVar5;
    }
    for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
      pauVar8 = (undefined1 (*) [64])
                (bottom_top_blob->cstep * uVar5 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      for (iVar7 = 0; iVar7 + 0xf < iVar3; iVar7 = iVar7 + 0x10) {
        auVar10 = vrcp14ps_avx512f(*pauVar8);
        in_ZMM3 = vmulps_avx512f(auVar9,auVar10);
        auVar11 = vfmsub213ps_avx512f(*pauVar8,in_ZMM3,auVar9);
        auVar10 = vfnmadd213ps_avx512f(auVar11,auVar10,in_ZMM3);
        *pauVar8 = auVar10;
        pauVar8 = pauVar8 + 1;
      }
      while( true ) {
        fVar12 = auVar9._0_4_;
        if (iVar3 <= iVar7 + 7) break;
        auVar24 = vrcpps_avx(*(undefined1 (*) [32])*pauVar8);
        auVar10._0_4_ = fVar12 * auVar24._0_4_;
        auVar10._4_4_ = auVar9._4_4_ * auVar24._4_4_;
        auVar10._8_4_ = auVar9._8_4_ * auVar24._8_4_;
        auVar10._12_4_ = auVar9._12_4_ * auVar24._12_4_;
        auVar10._16_4_ = auVar9._16_4_ * auVar24._16_4_;
        auVar10._20_4_ = auVar9._20_4_ * auVar24._20_4_;
        auVar10._28_36_ = in_ZMM3._28_36_;
        auVar10._24_4_ = auVar9._24_4_ * auVar24._24_4_;
        auVar28 = auVar10._0_32_;
        in_ZMM3 = ZEXT3264(auVar28);
        auVar13 = vfmsub213ps_fma(*(undefined1 (*) [32])*pauVar8,auVar28,auVar9._0_32_);
        auVar13 = vfnmadd213ps_fma(ZEXT1632(auVar13),auVar24,auVar28);
        *(undefined1 (*) [32])*pauVar8 = ZEXT1632(auVar13);
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x20);
        iVar7 = iVar7 + 8;
      }
      for (; iVar7 + 3 < iVar3; iVar7 = iVar7 + 4) {
        auVar13 = vrcpps_avx(*(undefined1 (*) [16])*pauVar8);
        auVar27._0_4_ = fVar12 * auVar13._0_4_;
        auVar27._4_4_ = auVar9._4_4_ * auVar13._4_4_;
        auVar27._8_4_ = auVar9._8_4_ * auVar13._8_4_;
        auVar27._12_4_ = auVar9._12_4_ * auVar13._12_4_;
        in_ZMM3 = ZEXT1664(auVar27);
        auVar26 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar8,auVar27,auVar9._0_16_);
        auVar13 = vfnmadd213ps_fma(auVar26,auVar13,auVar27);
        *(undefined1 (*) [16])*pauVar8 = auVar13;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x10);
      }
      for (; iVar7 < iVar3; iVar7 = iVar7 + 1) {
        *(float *)*pauVar8 = fVar12 / *(float *)*pauVar8;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 4);
      }
    }
  }
  return 0;
}

Assistant:

int BinaryOp_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace BinaryOp_x86_avx512_functor;

    if (op_type == Operation_ADD)
        return binary_op_scalar_inplace<binary_op_add>(bottom_top_blob, b, opt);

    if (op_type == Operation_SUB)
        return binary_op_scalar_inplace<binary_op_sub>(bottom_top_blob, b, opt);

    if (op_type == Operation_MUL)
        return binary_op_scalar_inplace<binary_op_mul>(bottom_top_blob, b, opt);

    if (op_type == Operation_DIV)
        return binary_op_scalar_inplace<binary_op_div>(bottom_top_blob, b, opt);

    if (op_type == Operation_MAX)
        return binary_op_scalar_inplace<binary_op_max>(bottom_top_blob, b, opt);

    if (op_type == Operation_MIN)
        return binary_op_scalar_inplace<binary_op_min>(bottom_top_blob, b, opt);

    if (op_type == Operation_POW)
        return binary_op_scalar_inplace<binary_op_pow>(bottom_top_blob, b, opt);

    if (op_type == Operation_RSUB)
        return binary_op_scalar_inplace<binary_op_rsub>(bottom_top_blob, b, opt);

    if (op_type == Operation_RDIV)
        return binary_op_scalar_inplace<binary_op_rdiv>(bottom_top_blob, b, opt);

    return 0;
}